

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_construct_deferred_tokens
          (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
           *this,Pipeflow *pf)

{
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,tf::DeferredPipeflow>,std::allocator<std::pair<unsigned_long_const,tf::DeferredPipeflow>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_long&,unsigned_long&,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>&&>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,tf::DeferredPipeflow>,std::allocator<std::pair<unsigned_long_const,tf::DeferredPipeflow>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->_deferred_tokens,&std::piecewise_construct);
  return;
}

Assistant:

void ScalablePipeline<P>::_construct_deferred_tokens(Pipeflow& pf) {
  
  // construct the deferred pipeflow with zero copy
  _deferred_tokens.emplace(
    std::piecewise_construct,
    std::forward_as_tuple(pf._token),
    std::forward_as_tuple(
      pf._token, pf._num_deferrals, std::move(pf._dependents)
    )
  );
}